

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::embedSubWindow(QGraphicsProxyWidgetPrivate *this,QWidget *subWin)

{
  bool bVar1;
  pointer pQVar2;
  QGraphicsItem *parent;
  QGraphicsProxyWidget *this_00;
  QGraphicsProxyWidgetPrivate *in_RDI;
  QGraphicsProxyWidget *subProxy;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *extra;
  bool in_stack_00000087;
  QGraphicsProxyWidgetPrivate *in_stack_00000088;
  QWidget *in_stack_000001b8;
  QWidget *this_01;
  
  QWidget::d_func((QWidget *)0x9b9bc5);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9b9bd8);
  if ((!bVar1) ||
     (pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9b9be8),
     pQVar2->proxyWidget == (QGraphicsProxyWidget *)0x0)) {
    parent = (QGraphicsItem *)operator_new(0x30);
    this_00 = q_func(in_RDI);
    this_01 = (QWidget *)0x0;
    if (this_00 != (QGraphicsProxyWidget *)0x0) {
      this_01 = (QWidget *)
                &(this_00->super_QGraphicsWidget).super_QGraphicsObject.super_QGraphicsItem;
    }
    QWidget::windowFlags(this_01);
    QGraphicsProxyWidget::QGraphicsProxyWidget
              (this_00,parent,
               (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)this_01 >> 0x20,0));
    QGraphicsProxyWidget::d_func((QGraphicsProxyWidget *)0x9b9c6e);
    setWidget_helper(in_stack_00000088,in_stack_000001b8,in_stack_00000087);
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::embedSubWindow(QWidget *subWin)
{
    const auto &extra = subWin->d_func()->extra;
    if (!extra || !extra->proxyWidget) {
        QGraphicsProxyWidget *subProxy = new QGraphicsProxyWidget(q_func(), subWin->windowFlags());
        subProxy->d_func()->setWidget_helper(subWin, false);
    }
}